

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O2

void __thiscall
cmLocalUnixMakefileGenerator3::CreateCDCommand
          (cmLocalUnixMakefileGenerator3 *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *commands,char *tgtDir,RelativeRoot relRetDir)

{
  cmOutputConverter *this_00;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __first;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __last;
  bool bVar1;
  int iVar2;
  char *pcVar3;
  allocator local_b9;
  string prefix;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  string outputForExisting;
  undefined1 local_58 [40];
  
  this_00 = &(this->super_cmLocalGenerator).super_cmOutputConverter;
  pcVar3 = cmOutputConverter::GetRelativeRootPath(this_00,relRetDir);
  iVar2 = strcmp(tgtDir,pcVar3);
  if (iVar2 != 0) {
    bVar1 = cmLocalGenerator::IsMinGWMake(&this->super_cmLocalGenerator);
    pcVar3 = "cd ";
    if (bVar1) {
      pcVar3 = "cd /d ";
    }
    if ((this->super_cmLocalGenerator).GlobalGenerator[1].MakeSilentFlag.field_2._M_local_buf[2] ==
        '\0') {
      std::__cxx11::string::string((string *)&outputForExisting,pcVar3,(allocator *)&prefix);
      std::__cxx11::string::string((string *)&local_98,tgtDir,&local_b9);
      cmOutputConverter::ConvertToOutputForExisting(&prefix,this_00,&local_98,relRetDir,SHELL);
      std::__cxx11::string::append((string *)&outputForExisting);
      std::__cxx11::string::~string((string *)&prefix);
      std::__cxx11::string::~string((string *)&local_98);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::insert(commands,(commands->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start,&outputForExisting);
      std::__cxx11::string::assign((char *)&outputForExisting);
      std::__cxx11::string::string((string *)&local_98,tgtDir,&local_b9);
      cmOutputConverter::ConvertToOutputForExisting(&prefix,this_00,relRetDir,&local_98,SHELL);
      std::__cxx11::string::append((string *)&outputForExisting);
      std::__cxx11::string::~string((string *)&prefix);
      std::__cxx11::string::~string((string *)&local_98);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(commands,&outputForExisting);
    }
    else {
      std::__cxx11::string::string((string *)&prefix,tgtDir,(allocator *)&local_98);
      cmOutputConverter::ConvertToOutputForExisting
                (&outputForExisting,this_00,&prefix,relRetDir,SHELL);
      std::__cxx11::string::~string((string *)&prefix);
      std::operator+(&local_98,pcVar3,&outputForExisting);
      std::operator+(&prefix,&local_98," && ");
      std::__cxx11::string::~string((string *)&local_98);
      __first._M_current =
           (commands->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
      __last._M_current =
           (commands->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      std::bind1st<std::plus<std::__cxx11::string>,std::__cxx11::string>
                ((binder1st<std::plus<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_58,
                 (plus<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_98,&prefix);
      std::
      transform<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::binder1st<std::plus<std::__cxx11::string>>>
                (__first,__last,__first,
                 (binder1st<std::plus<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_58);
      std::__cxx11::string::~string((string *)(local_58 + 8));
      std::__cxx11::string::~string((string *)&prefix);
    }
    std::__cxx11::string::~string((string *)&outputForExisting);
  }
  return;
}

Assistant:

void cmLocalUnixMakefileGenerator3
::CreateCDCommand(std::vector<std::string>& commands, const char *tgtDir,
                  cmLocalGenerator::RelativeRoot relRetDir)
{
  const char* retDir = this->GetRelativeRootPath(relRetDir);

  // do we need to cd?
  if (!strcmp(tgtDir,retDir))
    {
    return;
    }

  // In a Windows shell we must change drive letter too.  The shell
  // used by NMake and Borland make does not support "cd /d" so this
  // feature simply cannot work with them (Borland make does not even
  // support changing the drive letter with just "d:").
  const char* cd_cmd = this->IsMinGWMake() ? "cd /d " : "cd ";

  cmGlobalUnixMakefileGenerator3* gg =
    static_cast<cmGlobalUnixMakefileGenerator3*>(this->GlobalGenerator);
  if(!gg->UnixCD)
    {
    // On Windows we must perform each step separately and then change
    // back because the shell keeps the working directory between
    // commands.
    std::string cmd = cd_cmd;
    cmd += this->ConvertToOutputForExisting(tgtDir, relRetDir);
    commands.insert(commands.begin(),cmd);

    // Change back to the starting directory.
    cmd = cd_cmd;
    cmd += this->ConvertToOutputForExisting(relRetDir, tgtDir);
    commands.push_back(cmd);
    }
  else
    {
    // On UNIX we must construct a single shell command to change
    // directory and build because make resets the directory between
    // each command.
    std::string outputForExisting =
                          this->ConvertToOutputForExisting(tgtDir, relRetDir);
    std::string prefix = cd_cmd + outputForExisting + " && ";
    std::transform(commands.begin(), commands.end(), commands.begin(),
                   std::bind1st(std::plus<std::string>(), prefix));
    }
}